

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse2.cpp
# Opt level: O2

void qt_blend_rgb32_on_rgb32_sse2
               (uchar *destPixels,int dbpl,uchar *srcPixels,int sbpl,int w,int h,int const_alpha)

{
  ushort *puVar1;
  ushort *puVar2;
  uint a;
  uint uVar3;
  int iVar4;
  uint b;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int _i;
  uint uVar8;
  ulong uVar9;
  uchar *puVar10;
  ushort uVar11;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  short local_58;
  short sStack_56;
  short local_48;
  short sStack_46;
  
  if (const_alpha != 0) {
    if (const_alpha == 0x100) {
      qt_blend_rgb32_on_rgb32(destPixels,dbpl,srcPixels,sbpl,w,h,0x100);
    }
    else {
      a = const_alpha * 0xff >> 8;
      b = 0xff - a;
      auVar12 = pshuflw(ZEXT416(a),ZEXT416(a),0);
      auVar13 = pshuflw(ZEXT416(b),ZEXT416(b),0);
      uVar6 = (ulong)w;
      iVar4 = 0;
      puVar10 = destPixels;
      if (h < 1) {
        h = 0;
      }
      while( true ) {
        uVar9 = (ulong)((byte)-((byte)(((ulong)destPixels & 0xffffffff) >> 2) & 0x3f) & 3);
        if (uVar6 < uVar9) {
          uVar9 = uVar6;
        }
        if (iVar4 == h) break;
        uVar5 = (ulong)(-((uint)destPixels >> 2) & 3);
        if (uVar6 < uVar5) {
          uVar5 = uVar6;
        }
        for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
          uVar3 = INTERPOLATE_PIXEL_255
                            (*(uint *)(srcPixels + uVar7 * 4),a,*(uint *)(puVar10 + uVar7 * 4),b);
          *(uint *)(puVar10 + uVar7 * 4) = uVar3;
        }
        for (; (long)uVar5 < (long)(w + -3); uVar5 = uVar5 + 4) {
          puVar1 = (ushort *)(srcPixels + uVar5 * 4);
          puVar2 = (ushort *)(puVar10 + uVar5 * 4);
          local_48 = auVar12._0_2_;
          sStack_46 = auVar12._2_2_;
          local_58 = auVar13._0_2_;
          sStack_56 = auVar13._2_2_;
          uVar21 = (*puVar2 >> 8) * local_58 + (*puVar1 >> 8) * local_48;
          uVar22 = (puVar2[1] >> 8) * sStack_56 + (puVar1[1] >> 8) * sStack_46;
          uVar23 = (puVar2[2] >> 8) * local_58 + (puVar1[2] >> 8) * local_48;
          uVar24 = (puVar2[3] >> 8) * sStack_56 + (puVar1[3] >> 8) * sStack_46;
          uVar25 = (puVar2[4] >> 8) * local_58 + (puVar1[4] >> 8) * local_48;
          uVar26 = (puVar2[5] >> 8) * sStack_56 + (puVar1[5] >> 8) * sStack_46;
          uVar27 = (puVar2[6] >> 8) * local_58 + (puVar1[6] >> 8) * local_48;
          uVar28 = (puVar2[7] >> 8) * sStack_56 + (puVar1[7] >> 8) * sStack_46;
          uVar11 = (*puVar2 & 0xff) * local_58 + (*puVar1 & 0xff) * local_48;
          uVar14 = (puVar2[1] & 0xff) * sStack_56 + (puVar1[1] & 0xff) * sStack_46;
          uVar15 = (puVar2[2] & 0xff) * local_58 + (puVar1[2] & 0xff) * local_48;
          uVar16 = (puVar2[3] & 0xff) * sStack_56 + (puVar1[3] & 0xff) * sStack_46;
          uVar17 = (puVar2[4] & 0xff) * local_58 + (puVar1[4] & 0xff) * local_48;
          uVar18 = (puVar2[5] & 0xff) * sStack_56 + (puVar1[5] & 0xff) * sStack_46;
          uVar19 = (puVar2[6] & 0xff) * local_58 + (puVar1[6] & 0xff) * local_48;
          uVar20 = (puVar2[7] & 0xff) * sStack_56 + (puVar1[7] & 0xff) * sStack_46;
          puVar1 = (ushort *)(puVar10 + uVar5 * 4);
          *puVar1 = (ushort)(uVar11 + 0x80 + (uVar11 >> 8)) >> 8 |
                    uVar21 + 0x80 + (uVar21 >> 8) & 0xff00;
          puVar1[1] = (ushort)(uVar14 + 0x80 + (uVar14 >> 8)) >> 8 |
                      uVar22 + 0x80 + (uVar22 >> 8) & 0xff00;
          puVar1[2] = (ushort)(uVar15 + 0x80 + (uVar15 >> 8)) >> 8 |
                      uVar23 + 0x80 + (uVar23 >> 8) & 0xff00;
          puVar1[3] = (ushort)(uVar16 + 0x80 + (uVar16 >> 8)) >> 8 |
                      uVar24 + 0x80 + (uVar24 >> 8) & 0xff00;
          puVar1[4] = (ushort)(uVar17 + 0x80 + (uVar17 >> 8)) >> 8 |
                      uVar25 + 0x80 + (uVar25 >> 8) & 0xff00;
          puVar1[5] = (ushort)(uVar18 + 0x80 + (uVar18 >> 8)) >> 8 |
                      uVar26 + 0x80 + (uVar26 >> 8) & 0xff00;
          puVar1[6] = (ushort)(uVar19 + 0x80 + (uVar19 >> 8)) >> 8 |
                      uVar27 + 0x80 + (uVar27 >> 8) & 0xff00;
          puVar1[7] = (ushort)(uVar20 + 0x80 + (uVar20 >> 8)) >> 8 |
                      uVar28 + 0x80 + (uVar28 >> 8) & 0xff00;
        }
        uVar8 = 0;
        for (; (uVar8 < 3 && ((long)uVar5 < (long)uVar6)); uVar5 = uVar5 + 1) {
          uVar3 = INTERPOLATE_PIXEL_255
                            (*(uint *)(srcPixels + uVar5 * 4),a,*(uint *)(puVar10 + uVar5 * 4),b);
          *(uint *)(puVar10 + uVar5 * 4) = uVar3;
          uVar8 = uVar8 + 1;
        }
        srcPixels = srcPixels + sbpl;
        iVar4 = iVar4 + 1;
        destPixels = destPixels + dbpl;
        puVar10 = puVar10 + dbpl;
      }
    }
  }
  return;
}

Assistant:

void qt_blend_rgb32_on_rgb32_sse2(uchar *destPixels, int dbpl,
                                 const uchar *srcPixels, int sbpl,
                                 int w, int h,
                                 int const_alpha)
{
    const quint32 *src = (const quint32 *) srcPixels;
    quint32 *dst = (quint32 *) destPixels;
    if (const_alpha != 256) {
        if (const_alpha != 0) {
            const __m128i half = _mm_set1_epi16(0x80);
            const __m128i colorMask = _mm_set1_epi32(0x00ff00ff);

            const_alpha = (const_alpha * 255) >> 8;
            int one_minus_const_alpha = 255 - const_alpha;
            const __m128i constAlphaVector = _mm_set1_epi16(const_alpha);
            const __m128i oneMinusConstAlpha =  _mm_set1_epi16(one_minus_const_alpha);
            for (int y = 0; y < h; ++y) {
                int x = 0;

                // First, align dest to 16 bytes:
                ALIGNMENT_PROLOGUE_16BYTES(dst, x, w) {
                    dst[x] = INTERPOLATE_PIXEL_255(src[x], const_alpha, dst[x], one_minus_const_alpha);
                }

                for (; x < w-3; x += 4) {
                    __m128i srcVector = _mm_loadu_si128((const __m128i *)&src[x]);
                    const __m128i dstVector = _mm_load_si128((__m128i *)&dst[x]);
                    __m128i result;
                    INTERPOLATE_PIXEL_255_SSE2(result, srcVector, dstVector, constAlphaVector, oneMinusConstAlpha, colorMask, half);
                    _mm_store_si128((__m128i *)&dst[x], result);
                }
                SIMD_EPILOGUE(x, w, 3)
                    dst[x] = INTERPOLATE_PIXEL_255(src[x], const_alpha, dst[x], one_minus_const_alpha);
                dst = (quint32 *)(((uchar *) dst) + dbpl);
                src = (const quint32 *)(((const uchar *) src) + sbpl);
            }
        }
    } else {
        qt_blend_rgb32_on_rgb32(destPixels, dbpl, srcPixels, sbpl, w, h, const_alpha);
    }
}